

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_parse_expect_semi(JSParseState *s)

{
  JSParseState *in_RDI;
  JSParseState *in_stack_00000048;
  int local_4;
  
  if ((in_RDI->token).val == 0x3b) {
    local_4 = next_token(in_stack_00000048);
  }
  else if ((((in_RDI->token).val == -0x56) || ((in_RDI->token).val == 0x7d)) ||
          (in_RDI->got_lf != 0)) {
    local_4 = 0;
  }
  else {
    local_4 = js_parse_error(in_RDI,"expecting \'%c\'",0x3b);
  }
  return local_4;
}

Assistant:

static int js_parse_expect_semi(JSParseState *s)
{
    if (s->token.val != ';') {
        /* automatic insertion of ';' */
        if (s->token.val == TOK_EOF || s->token.val == '}' || s->got_lf) {
            return 0;
        }
        return js_parse_error(s, "expecting '%c'", ';');
    }
    return next_token(s);
}